

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate1<std::complex<double>_>::apply
          (QGate1<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  undefined7 in_register_00000031;
  int iVar2;
  undefined4 in_register_00000084;
  anon_class_72_5_b506d461 f;
  undefined1 local_88 [8];
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> local_80;
  anon_class_72_5_b506d461 local_78;
  
  iVar2 = offset;
  iVar1 = (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(local_88,this);
  lambda_QGate1<std::complex<double>>
            (&local_78,(qgates *)(CONCAT71(in_register_00000031,op) & 0xffffffff),(Op)local_88,
             (SquareMatrix<std::complex<double>_> *)
             (vector->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (complex<double> *)CONCAT44(in_register_00000084,iVar2));
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_80);
  apply2<qclab::qgates::lambda_QGate1<std::complex<double>>(qclab::Op,qclab::dense::SquareMatrix<std::complex<double>>,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,&local_78);
  return;
}

Assistant:

void QGate1< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_QGate1( op , this->matrix() , vector.data() ) ;
    apply2( nbQubits , qubit , f ) ;
  }